

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void change_ssa_edge_list_def
               (ssa_edge_t_conflict list,bb_insn_t_conflict new_bb_insn,uint new_def_op_num,
               MIR_reg_t reg,MIR_reg_t new_reg)

{
  char cVar1;
  uint uVar2;
  MIR_insn_t pMVar3;
  
  if (new_reg < 0x22) {
    __assert_fail("new_reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x978,
                  "void change_ssa_edge_list_def(ssa_edge_t, bb_insn_t, unsigned int, MIR_reg_t, MIR_reg_t)"
                 );
  }
  do {
    if (list == (ssa_edge_t_conflict)0x0) {
      return;
    }
    list->def = new_bb_insn;
    list->def_op_num = (uint16_t)new_def_op_num;
    if (new_reg != 0xffffffff) {
      uVar2 = list->use_op_num;
      pMVar3 = list->use->insn;
      cVar1 = pMVar3->ops[uVar2].field_0x8;
      if (cVar1 == '\v') {
        if (pMVar3->ops[uVar2].u.mem.base == reg) {
          pMVar3->ops[uVar2].u.mem.base = new_reg;
        }
        if (pMVar3->ops[uVar2].u.mem.index == reg) {
          pMVar3->ops[uVar2].u.mem.index = new_reg;
        }
      }
      else {
        if (cVar1 != '\x02') {
          __assert_fail("op_ref->mode == MIR_OP_VAR_MEM",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x981,
                        "void change_ssa_edge_list_def(ssa_edge_t, bb_insn_t, unsigned int, MIR_reg_t, MIR_reg_t)"
                       );
        }
        if (pMVar3->ops[uVar2].u.reg == reg) {
          pMVar3->ops[uVar2].u.reg = new_reg;
        }
      }
    }
    list = list->next_use;
  } while( true );
}

Assistant:

static void change_ssa_edge_list_def (ssa_edge_t list, bb_insn_t new_bb_insn,
                                      unsigned new_def_op_num, MIR_reg_t reg, MIR_reg_t new_reg) {
  gen_assert (new_reg > MAX_HARD_REG);
  for (ssa_edge_t se = list; se != NULL; se = se->next_use) {
    se->def = new_bb_insn;
    se->def_op_num = new_def_op_num;
    if (new_reg != MIR_NON_VAR) {
      MIR_op_t *op_ref = &se->use->insn->ops[se->use_op_num];
      if (op_ref->mode == MIR_OP_VAR) {
        if (op_ref->u.var == reg) op_ref->u.var = new_reg;
      } else {
        gen_assert (op_ref->mode == MIR_OP_VAR_MEM);
        if (op_ref->u.var_mem.base == reg) op_ref->u.var_mem.base = new_reg;
        if (op_ref->u.var_mem.index == reg) op_ref->u.var_mem.index = new_reg;
      }
    }
  }
}